

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O0

void __thiscall IRT::Label::Label(Label *this)

{
  int __val;
  string local_30;
  Label *local_10;
  Label *this_local;
  
  __val = counter_;
  counter_ = counter_ + 1;
  local_10 = this;
  std::__cxx11::to_string(&local_30,__val);
  std::operator+(&this->label_,"L",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

IRT::Label::Label(): label_("L" + std::to_string(counter_++)) {
}